

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndirectComputeDispatchTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::IndirectComputeDispatchTests::init
          (IndirectComputeDispatchTests *this,EVP_PKEY_CTX *ctx)

{
  GenBuffer genBuffer;
  IndirectComputeDispatchTests *pIVar1;
  TestNode *node;
  TestNode *pTVar2;
  long lVar3;
  int local_3c;
  int ndx;
  TestCaseGroup *genGroup;
  uint local_28;
  GenBuffer genBuf;
  int genNdx;
  IndirectComputeDispatchTests *this_local;
  
  pIVar1 = this;
  if (init()::s_singleDispatchCases == '\0') {
    pIVar1 = (IndirectComputeDispatchTests *)__cxa_guard_acquire(&init()::s_singleDispatchCases);
    if ((int)pIVar1 != 0) {
      init::s_singleDispatchCases[0].name = "single_invocation";
      init::s_singleDispatchCases[0].description = "Single invocation only from offset 0";
      init::s_singleDispatchCases[0].bufferSize = 0xc;
      init::s_singleDispatchCases[0].offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[0].workGroupSize,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[0].numWorkGroups,1,1,1);
      init::s_singleDispatchCases[1].name = "multiple_groups";
      init::s_singleDispatchCases[1].description = "Multiple groups dispatched from offset 0";
      init::s_singleDispatchCases[1].bufferSize = 0xc;
      init::s_singleDispatchCases[1].offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[1].workGroupSize,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[1].numWorkGroups,2,3,5);
      init::s_singleDispatchCases[2].name = "multiple_groups_multiple_invocations";
      init::s_singleDispatchCases[2].description = "Multiple groups of size 2x3x1 from offset 0";
      init::s_singleDispatchCases[2].bufferSize = 0xc;
      init::s_singleDispatchCases[2].offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[2].workGroupSize,2,3,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[2].numWorkGroups,1,2,3);
      init::s_singleDispatchCases[3].name = "small_offset";
      init::s_singleDispatchCases[3].description = "Small offset";
      init::s_singleDispatchCases[3].bufferSize = 0x1c;
      init::s_singleDispatchCases[3].offset = 0x10;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[3].workGroupSize,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[3].numWorkGroups,1,1,1);
      init::s_singleDispatchCases[4].name = "large_offset";
      init::s_singleDispatchCases[4].description = "Large offset";
      init::s_singleDispatchCases[4].bufferSize = 0x200000;
      init::s_singleDispatchCases[4].offset = 0x10000c;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[4].workGroupSize,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[4].numWorkGroups,1,1,1);
      init::s_singleDispatchCases[5].name = "large_offset_multiple_invocations";
      init::s_singleDispatchCases[5].description = "Large offset, multiple invocations";
      init::s_singleDispatchCases[5].bufferSize = 0x200000;
      init::s_singleDispatchCases[5].offset = 0x10000c;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[5].workGroupSize,2,3,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[5].numWorkGroups,1,2,3);
      init::s_singleDispatchCases[6].name = "empty_command";
      init::s_singleDispatchCases[6].description = "Empty command";
      init::s_singleDispatchCases[6].bufferSize = 0xc;
      init::s_singleDispatchCases[6].offset = 0;
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[6].workGroupSize,1,1,1);
      tcu::Vector<unsigned_int,_3>::Vector(&init::s_singleDispatchCases[6].numWorkGroups,0,0,0);
      pIVar1 = (IndirectComputeDispatchTests *)__cxa_guard_release(&init()::s_singleDispatchCases);
    }
  }
  local_28 = 0;
  while ((int)local_28 < 2) {
    genBuffer = init::s_genBuffer[(int)local_28].gen;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::s_genBuffer[(int)local_28].name,"");
    tcu::TestNode::addChild((TestNode *)this,node);
    for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
      pTVar2 = (TestNode *)operator_new(0xb0);
      lVar3 = (long)local_3c;
      anon_unknown_1::SingleDispatchCase::SingleDispatchCase
                ((SingleDispatchCase *)pTVar2,(this->super_TestCaseGroup).m_context,
                 init::s_singleDispatchCases[lVar3].name,
                 init::s_singleDispatchCases[lVar3].description,genBuffer,
                 init::s_singleDispatchCases[lVar3].bufferSize,
                 init::s_singleDispatchCases[lVar3].offset,
                 &init::s_singleDispatchCases[lVar3].workGroupSize,
                 &init::s_singleDispatchCases[lVar3].numWorkGroups);
      tcu::TestNode::addChild(node,pTVar2);
    }
    pTVar2 = (TestNode *)operator_new(0xb0);
    anon_unknown_1::MultiDispatchCase::MultiDispatchCase
              ((MultiDispatchCase *)pTVar2,(this->super_TestCaseGroup).m_context,genBuffer);
    tcu::TestNode::addChild(node,pTVar2);
    pTVar2 = (TestNode *)operator_new(0xb0);
    anon_unknown_1::MultiDispatchReuseCommandCase::MultiDispatchReuseCommandCase
              ((MultiDispatchReuseCommandCase *)pTVar2,(this->super_TestCaseGroup).m_context,
               genBuffer);
    tcu::TestNode::addChild(node,pTVar2);
    local_28 = local_28 + 1;
    pIVar1 = (IndirectComputeDispatchTests *)(ulong)local_28;
  }
  return (int)pIVar1;
}

Assistant:

void IndirectComputeDispatchTests::init (void)
{
	static const struct
	{
		const char*		name;
		GenBuffer		gen;
	} s_genBuffer[] =
	{
		{ "upload_buffer",		GEN_BUFFER_UPLOAD	},
		{ "gen_in_compute",		GEN_BUFFER_COMPUTE	}
	};

	static const struct
	{
		const char*	name;
		const char*	description;
		deUintptr	bufferSize;
		deUintptr	offset;
		UVec3		workGroupSize;
		UVec3		numWorkGroups;
	} s_singleDispatchCases[] =
	{
	//	Name										Desc											BufferSize					Offs			WorkGroupSize	NumWorkGroups
		{ "single_invocation",						"Single invocation only from offset 0",			INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "multiple_groups",						"Multiple groups dispatched from offset 0",		INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(2,3,5) },
		{ "multiple_groups_multiple_invocations",	"Multiple groups of size 2x3x1 from offset 0",	INDIRECT_COMMAND_SIZE,		0,				UVec3(2,3,1),	UVec3(1,2,3) },
		{ "small_offset",							"Small offset",									16+INDIRECT_COMMAND_SIZE,	16,				UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset",							"Large offset",									(2<<20),					(1<<20) + 12,	UVec3(1,1,1),	UVec3(1,1,1) },
		{ "large_offset_multiple_invocations",		"Large offset, multiple invocations",			(2<<20),					(1<<20) + 12,	UVec3(2,3,1),	UVec3(1,2,3) },
		{ "empty_command",							"Empty command",								INDIRECT_COMMAND_SIZE,		0,				UVec3(1,1,1),	UVec3(0,0,0) },
	};

	for (int genNdx = 0; genNdx < DE_LENGTH_OF_ARRAY(s_genBuffer); genNdx++)
	{
		const GenBuffer				genBuf		= s_genBuffer[genNdx].gen;
		tcu::TestCaseGroup* const	genGroup	= new tcu::TestCaseGroup(m_testCtx, s_genBuffer[genNdx].name, "");
		addChild(genGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_singleDispatchCases); ndx++)
			genGroup->addChild(new SingleDispatchCase(m_context,
													  s_singleDispatchCases[ndx].name,
													  s_singleDispatchCases[ndx].description,
													  genBuf,
													  s_singleDispatchCases[ndx].bufferSize,
													  s_singleDispatchCases[ndx].offset,
													  s_singleDispatchCases[ndx].workGroupSize,
													  s_singleDispatchCases[ndx].numWorkGroups));

		genGroup->addChild(new MultiDispatchCase				(m_context, genBuf));
		genGroup->addChild(new MultiDispatchReuseCommandCase	(m_context, genBuf));
	}
}